

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

expr * printreg(disctx *ctx,ull *a,ull *m,reg *reg)

{
  uint uVar1;
  int iVar2;
  sreg *psVar3;
  ull uVar4;
  expr *peVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  
  if (reg->bf == (bitfield *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = getbf(reg->bf,a,m,ctx);
  }
  psVar3 = reg->specials;
  if (psVar3 != (sreg *)0x0) {
    for (lVar10 = 0; uVar8 = (ulong)*(int *)((long)&psVar3->num + lVar10),
        uVar8 != 0xffffffffffffffff; lVar10 = lVar10 + 0x18) {
      uVar1 = *(uint *)((long)&psVar3->vartype + lVar10);
      if (((uVar1 == 0) || ((ctx->vartype & uVar1) != 0)) && (uVar4 == uVar8)) {
        switch(*(undefined4 *)((long)&psVar3->mode + lVar10)) {
        case 0:
          peVar5 = makeex(EXPR_REG);
          peVar5->str = *(char **)((long)&reg->specials->name + lVar10);
          peVar5->special = 1;
          return peVar5;
        case 1:
          return (expr *)0x0;
        case 2:
          peVar5 = makeex(EXPR_NUM);
          peVar5->num1 = 1;
          return peVar5;
        case 3:
          peVar5 = makeex(EXPR_DISCARD);
          return peVar5;
        }
      }
    }
  }
  peVar5 = makeex(EXPR_REG);
  pcVar7 = "";
  if (reg->suffix != (char *)0x0) {
    pcVar7 = reg->suffix;
  }
  iVar2 = reg->hilo;
  pcVar6 = "h";
  if ((uVar4 & 1) == 0) {
    pcVar6 = "l";
  }
  if (iVar2 == 0) {
    pcVar6 = pcVar7;
  }
  if (reg->always_special == 0) {
    iVar9 = reg->cool;
  }
  else {
    iVar9 = 2;
  }
  peVar5->special = iVar9;
  if (reg->bf == (bitfield *)0x0) {
    pcVar7 = aprint("%s%s",reg->name,pcVar6);
  }
  else {
    pcVar7 = aprint("%s%lld%s",reg->name,uVar4 >> (iVar2 != 0),pcVar6);
  }
  peVar5->str = pcVar7;
  return peVar5;
}

Assistant:

static struct expr *printreg (struct disctx *ctx, ull *a, ull *m, const struct reg *reg) {
	struct expr *expr;
	ull num = 0;
	if (reg->bf)
		num = GETBF(reg->bf);
	if (reg->specials) {
		int i;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (reg->specials[i].vartype && !(reg->specials[i].vartype & ctx->vartype))
				continue;
			if (num == reg->specials[i].num) {
				switch (reg->specials[i].mode) {
					case SR_NAMED:
						expr = makeex(EXPR_REG);
						expr->str = reg->specials[i].name;
						expr->special = 1;
						return expr;
					case SR_ZERO:
						return 0;
					case SR_ONE:
						expr = makeex(EXPR_NUM);
						expr->num1 = 1;
						return expr;
					case SR_DISCARD:
						expr = makeex(EXPR_DISCARD);
						return expr;
				}
			}
		}
	}
	expr = makeex(EXPR_REG);
	const char *suf = "";
	if (reg->suffix)
		suf = reg->suffix;
	if (reg->hilo) {
		if (num & 1)
			suf = "h";
		else
			suf = "l";
		num >>= 1;
	}
	expr->special = reg->cool;
	if (reg->always_special)
		expr->special = 2;
	if (reg->bf)
		expr->str = aprint("%s%lld%s", reg->name, num, suf);
	else
		expr->str = aprint("%s%s", reg->name, suf);
	return expr;
}